

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exhaustive_tester.cc
# Opt level: O0

void re2::ExhaustiveTest(int maxatoms,int maxops,
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *alphabet,
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *ops,int maxstrlen,
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *stralphabet,string *wrapper,string *topwrapper)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  size_type sVar5;
  ostream *poVar6;
  LogMessage local_2e0;
  undefined1 local_150 [8];
  ExhaustiveTester t;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *stralphabet_local;
  int maxstrlen_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *ops_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *alphabet_local;
  int maxops_local;
  int maxatoms_local;
  
  stralphabet_local._4_4_ = maxstrlen;
  alphabet_local._0_4_ = maxops;
  alphabet_local._4_4_ = maxatoms;
  if ((FLAGS_quick_debug_mode & 1) != 0) {
    if (1 < maxatoms) {
      alphabet_local._4_4_ = maxatoms + -1;
    }
    if (1 < maxops) {
      alphabet_local._0_4_ = maxops + -1;
    }
    if (1 < maxstrlen) {
      stralphabet_local._4_4_ = maxstrlen - 1;
    }
  }
  t._280_8_ = stralphabet;
  ExhaustiveTester::ExhaustiveTester
            ((ExhaustiveTester *)local_150,alphabet_local._4_4_,(int)alphabet_local,alphabet,ops,
             stralphabet_local._4_4_,stralphabet,wrapper,topwrapper);
  RegexpGenerator::Generate((RegexpGenerator *)local_150);
  uVar1 = ExhaustiveTester::regexps((ExhaustiveTester *)local_150);
  uVar2 = ExhaustiveTester::tests((ExhaustiveTester *)local_150);
  uVar3 = ExhaustiveTester::failures((ExhaustiveTester *)local_150);
  sVar5 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)t._280_8_);
  printf("%d regexps, %d tests, %d failures [%d/%d str]\n",(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,
         (ulong)stralphabet_local._4_4_,sVar5 & 0xffffffff);
  iVar4 = ExhaustiveTester::failures((ExhaustiveTester *)local_150);
  if (iVar4 != 0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_2e0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/exhaustive_tester.cc"
               ,0xa7);
    poVar6 = LogMessage::stream(&local_2e0);
    std::operator<<(poVar6,"Check failed: (0) == (t.failures())");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_2e0);
  }
  ExhaustiveTester::~ExhaustiveTester((ExhaustiveTester *)local_150);
  return;
}

Assistant:

void ExhaustiveTest(int maxatoms, int maxops,
                    const vector<string>& alphabet,
                    const vector<string>& ops,
                    int maxstrlen, const vector<string>& stralphabet,
                    const string& wrapper,
                    const string& topwrapper) {
  if (RE2_DEBUG_MODE && FLAGS_quick_debug_mode) {
    if (maxatoms > 1)
      maxatoms--;
    if (maxops > 1)
      maxops--;
    if (maxstrlen > 1)
      maxstrlen--;
  }
  ExhaustiveTester t(maxatoms, maxops, alphabet, ops,
                     maxstrlen, stralphabet, wrapper,
                     topwrapper);
  t.Generate();
  if (!LOGGING) {
    printf("%d regexps, %d tests, %d failures [%d/%d str]\n",
           t.regexps(), t.tests(), t.failures(), maxstrlen, (int)stralphabet.size());
  }
  EXPECT_EQ(0, t.failures());
}